

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

gboolean timerSourcePrepareHelper(GTimerSource *src,gint *timeout)

{
  bool bVar1;
  int iVar2;
  rep x;
  duration<long,_std::ratio<1L,_1000L>_> *in_RSI;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  long in_FS_OFFSET;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> remaining;
  undefined4 in_stack_ffffffffffffff98;
  ProcessEventsFlag in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_44;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  rep local_38;
  rep local_30;
  QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4> local_1c;
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c.super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i =
       (QFlagsStorage<QEventLoop::ProcessEventsFlag>)
       QFlags<QEventLoop::ProcessEventsFlag>::operator&
                 ((QFlags<QEventLoop::ProcessEventsFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff9c);
  bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_1c);
  if (bVar1) {
    *(undefined4 *)&in_RSI->__r = 0xffffffff;
    local_44 = 1;
  }
  else {
    oVar3 = QTimerInfoList::timerWait((QTimerInfoList *)&DAT_aaaaaaaaaaaaaaaa);
    local_18 = oVar3.
               super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ._M_payload;
    local_10 = oVar3.
               super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ._M_engaged;
    local_38 = (rep)ms<(char)49>();
    local_30 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator-
                              ((duration<long,_std::ratio<1L,_1000L>_> *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::optional<std::chrono::duration<long,std::ratio<1l,1000000000l>>>::
    value_or<std::chrono::duration<long,std::ratio<1l,1000l>>>(in_RDI,in_RSI);
    local_40.__r = (rep)std::chrono::
                        ceil<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    x = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_40);
    iVar2 = q26::saturate_cast<int,long>(x);
    *(int *)&in_RSI->__r = iVar2;
    local_44 = (uint)((int)in_RSI->__r == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

static gboolean timerSourcePrepareHelper(GTimerSource *src, gint *timeout)
{
    if (src->processEventsFlags & QEventLoop::X11ExcludeTimers) {
        *timeout = -1;
        return true;
    }

    auto remaining = src->timerList.timerWait().value_or(-1ms);
    *timeout = q26::saturate_cast<gint>(ceil<milliseconds>(remaining).count());

    return (*timeout == 0);
}